

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O1

void __thiscall
TPZFNMatrix<3,_TPZFlopCounter>::TPZFNMatrix
          (TPZFNMatrix<3,_TPZFlopCounter> *this,int64_t row,int64_t col,TPZFlopCounter *val)

{
  TPZFlopCounter *pTVar1;
  ulong uVar2;
  
  (this->super_TPZFMatrix<TPZFlopCounter>).super_TPZMatrix<TPZFlopCounter>.super_TPZBaseMatrix.fRow
       = 0;
  (this->super_TPZFMatrix<TPZFlopCounter>).super_TPZMatrix<TPZFlopCounter>.super_TPZBaseMatrix.fCol
       = 0;
  (this->super_TPZFMatrix<TPZFlopCounter>).super_TPZMatrix<TPZFlopCounter>.super_TPZBaseMatrix.fRow
       = row;
  (this->super_TPZFMatrix<TPZFlopCounter>).super_TPZMatrix<TPZFlopCounter>.super_TPZBaseMatrix.fCol
       = col;
  (this->super_TPZFMatrix<TPZFlopCounter>).super_TPZMatrix<TPZFlopCounter>.super_TPZBaseMatrix.
  fDecomposed = '\0';
  (this->super_TPZFMatrix<TPZFlopCounter>).super_TPZMatrix<TPZFlopCounter>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  (this->super_TPZFMatrix<TPZFlopCounter>).super_TPZMatrix<TPZFlopCounter>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01873968;
  (this->super_TPZFMatrix<TPZFlopCounter>).fElem = this->fBuf;
  (this->super_TPZFMatrix<TPZFlopCounter>).fGiven = this->fBuf;
  (this->super_TPZFMatrix<TPZFlopCounter>).fSize = 3;
  pTVar1 = (TPZFlopCounter *)0x0;
  TPZVec<int>::TPZVec(&(this->super_TPZFMatrix<TPZFlopCounter>).fPivot.super_TPZVec<int>,0);
  (this->super_TPZFMatrix<TPZFlopCounter>).fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->super_TPZFMatrix<TPZFlopCounter>).fPivot.super_TPZVec<int>.fStore =
       (this->super_TPZFMatrix<TPZFlopCounter>).fPivot.fExtAlloc;
  (this->super_TPZFMatrix<TPZFlopCounter>).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->super_TPZFMatrix<TPZFlopCounter>).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->super_TPZFMatrix<TPZFlopCounter>).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01862128;
  (this->super_TPZFMatrix<TPZFlopCounter>).fWork.fStore = (TPZFlopCounter *)0x0;
  (this->super_TPZFMatrix<TPZFlopCounter>).fWork.fNElements = 0;
  (this->super_TPZFMatrix<TPZFlopCounter>).fWork.fNAlloc = 0;
  uVar2 = col * row;
  if (uVar2 != 0) {
    if ((long)uVar2 < 4) goto LAB_00c7efa3;
    pTVar1 = (TPZFlopCounter *)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar2 * 8);
  }
  (this->super_TPZFMatrix<TPZFlopCounter>).fElem = pTVar1;
LAB_00c7efa3:
  (this->super_TPZFMatrix<TPZFlopCounter>).super_TPZMatrix<TPZFlopCounter>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_01873678;
  TPZFMatrix<TPZFlopCounter>::operator=
            (&this->super_TPZFMatrix<TPZFlopCounter>,(TPZFlopCounter)val->fVal);
  return;
}

Assistant:

inline  TPZFNMatrix(int64_t row, int64_t col, const TVar &val) : TPZRegisterClassId(&TPZFNMatrix<N,TVar>::ClassId), 
    TPZFMatrix<TVar>(row,col,fBuf,N) {
        TPZFMatrix<TVar>::operator=(val);
    }